

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O0

__m256i * unpack_weights_avx2(ConvolveParams *conv_params)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long in_RDI;
  __m256i wt;
  __m256i wt1;
  __m256i wt0;
  int w1;
  int w0;
  undefined2 local_118;
  undefined2 local_114;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar1 = *(uint *)(in_RDI + 0x28);
  uVar2 = *(uint *)(in_RDI + 0x2c);
  local_114 = (ushort)uVar1;
  auVar3 = vpinsrw_avx(ZEXT216(local_114),uVar1 & 0xffff,1);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,2);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,3);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,4);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,5);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,6);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,7);
  auVar4 = vpinsrw_avx(ZEXT216(local_114),uVar1 & 0xffff,1);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,2);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,3);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,4);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,5);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,6);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,7);
  uStack_b0 = auVar4._0_8_;
  uStack_a8 = auVar4._8_8_;
  local_118 = (ushort)uVar2;
  auVar4 = vpinsrw_avx(ZEXT216(local_118),uVar2 & 0xffff,1);
  auVar4 = vpinsrw_avx(auVar4,uVar2 & 0xffff,2);
  auVar4 = vpinsrw_avx(auVar4,uVar2 & 0xffff,3);
  auVar4 = vpinsrw_avx(auVar4,uVar2 & 0xffff,4);
  auVar4 = vpinsrw_avx(auVar4,uVar2 & 0xffff,5);
  auVar4 = vpinsrw_avx(auVar4,uVar2 & 0xffff,6);
  auVar4 = vpinsrw_avx(auVar4,uVar2 & 0xffff,7);
  auVar5 = vpinsrw_avx(ZEXT216(local_118),uVar2 & 0xffff,1);
  auVar5 = vpinsrw_avx(auVar5,uVar2 & 0xffff,2);
  auVar5 = vpinsrw_avx(auVar5,uVar2 & 0xffff,3);
  auVar5 = vpinsrw_avx(auVar5,uVar2 & 0xffff,4);
  auVar5 = vpinsrw_avx(auVar5,uVar2 & 0xffff,5);
  auVar5 = vpinsrw_avx(auVar5,uVar2 & 0xffff,6);
  auVar5 = vpinsrw_avx(auVar5,uVar2 & 0xffff,7);
  uStack_70 = auVar5._0_8_;
  uStack_68 = auVar5._8_8_;
  auVar7._16_8_ = uStack_b0;
  auVar7._0_16_ = auVar3;
  auVar7._24_8_ = uStack_a8;
  auVar6._16_8_ = uStack_70;
  auVar6._0_16_ = auVar4;
  auVar6._24_8_ = uStack_68;
  vpunpcklwd_avx2(auVar7,auVar6);
  return (__m256i *)(ulong)local_118;
}

Assistant:

static inline __m256i unpack_weights_avx2(ConvolveParams *conv_params) {
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi16((int16_t)w0);
  const __m256i wt1 = _mm256_set1_epi16((int16_t)w1);
  const __m256i wt = _mm256_unpacklo_epi16(wt0, wt1);
  return wt;
}